

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::AssignmentExpression_const*,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::AssignmentExpression_const*,void>,std::equal_to<slang::ast::AssignmentExpression_const*>,std::allocator<std::pair<slang::ast::AssignmentExpression_const*const,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>>>
::
nosize_unchecked_emplace_at<std::pair<slang::ast::AssignmentExpression_const*&&,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::AssignmentExpression_const*,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::AssignmentExpression_const*,void>,std::equal_to<slang::ast::AssignmentExpression_const*>,std::allocator<std::pair<slang::ast::AssignmentExpression_const*const,std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>,std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,2ul>>>>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<const_slang::ast::AssignmentExpression_*&&,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_&&>
          *args)

{
  group_type_pointer pgVar1;
  ulong uVar2;
  value_type_pointer ppVar3;
  unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
  *puVar4;
  uint uVar5;
  ushort uVar6;
  ulong uVar7;
  long lVar8;
  group_type_pointer pgVar9;
  ulong uVar10;
  pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>
  *ppVar11;
  group_type_pointer pgVar12;
  undefined1 auVar13 [16];
  
  pgVar9 = __return_storage_ptr__->pg;
  uVar2 = arrays_->groups_size_mask;
  uVar7 = (ulong)__return_storage_ptr__->n;
  ppVar11 = __return_storage_ptr__->p;
  lVar8 = 1;
  while( true ) {
    pgVar12 = arrays_->groups_ + pos0;
    pgVar1 = arrays_->groups_ + pos0;
    auVar13[0] = -(pgVar1->m[0].n == '\0');
    auVar13[1] = -(pgVar1->m[1].n == '\0');
    auVar13[2] = -(pgVar1->m[2].n == '\0');
    auVar13[3] = -(pgVar1->m[3].n == '\0');
    auVar13[4] = -(pgVar1->m[4].n == '\0');
    auVar13[5] = -(pgVar1->m[5].n == '\0');
    auVar13[6] = -(pgVar1->m[6].n == '\0');
    auVar13[7] = -(pgVar1->m[7].n == '\0');
    auVar13[8] = -(pgVar1->m[8].n == '\0');
    auVar13[9] = -(pgVar1->m[9].n == '\0');
    auVar13[10] = -(pgVar1->m[10].n == '\0');
    auVar13[0xb] = -(pgVar1->m[0xb].n == '\0');
    auVar13[0xc] = -(pgVar1->m[0xc].n == '\0');
    auVar13[0xd] = -(pgVar1->m[0xd].n == '\0');
    auVar13[0xe] = -(pgVar1->m[0xe].n == '\0');
    auVar13[0xf] = -(pgVar1->m[0xf].n == '\0');
    uVar6 = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe;
    if (uVar6 == 0) {
      pgVar12->m[0xf].n = pgVar12->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar5 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar7 = (ulong)uVar5;
      ppVar3 = arrays_->elements_;
      uVar10 = (ulong)(uVar5 << 4);
      ppVar11 = (pair<const_slang::ast::AssignmentExpression_*const,_std::unique_ptr<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>_>
                 *)((long)&ppVar3[pos0 * 0xf].first + uVar10);
      *(AssignmentExpression **)((long)&ppVar3[pos0 * 0xf].first + uVar10) = *args->first;
      puVar4 = args->second;
      *(SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL> **)
       ((long)&ppVar3[pos0 * 0xf].second._M_t.
               super___uniq_ptr_impl<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_*,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
               .
               super__Head_base<0UL,_slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_*,_false>
               ._M_head_impl + uVar10) =
           (puVar4->_M_t).
           super___uniq_ptr_impl<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_*,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
           .
           super__Head_base<0UL,_slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_*,_false>
           ._M_head_impl;
      (puVar4->_M_t).
      super___uniq_ptr_impl<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_*,_std::default_delete<slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_>_>
      .
      super__Head_base<0UL,_slang::SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL>_*,_false>
      ._M_head_impl = (SmallVector<slang::ast::UnrollVisitor::PerAssignDriverState,_2UL> *)0x0;
      pgVar12->m[uVar7].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar9 = pgVar12;
    }
    if (uVar6 != 0) break;
    pos0 = pos0 + lVar8 & uVar2;
    lVar8 = lVar8 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar7;
  __return_storage_ptr__->p = ppVar11;
  __return_storage_ptr__->pg = pgVar9;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }